

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

floatx80 float128_to_floatx80_m68k(float128 a,float_status *status)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  floatx80 fVar4;
  int32_t aExp;
  uint64_t aSig0;
  uint64_t aSig1;
  uint local_24;
  ulong local_20;
  ulong local_18;
  
  uVar3 = a.high;
  local_18 = a.low;
  local_20 = uVar3 & 0xffffffffffff;
  local_24 = a.high._6_2_ & 0x7fff;
  uVar1 = a.high._4_4_ >> 0x1f;
  if (((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) {
    if (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
        local_18 != 0) {
      normalizeFloat128Subnormal(local_20,local_18,(int32_t *)&local_24,&local_20,&local_18);
      goto LAB_006cc74e;
    }
    uVar1 = uVar1 << 0xf;
  }
  else {
    if (local_24 != 0x7fff) {
      local_20 = local_20 + 0x1000000000000;
LAB_006cc74e:
      local_20 = local_20 << 0xf | local_18 >> 0x31;
      local_18 = local_18 << 0xf;
      fVar4 = roundAndPackFloatx80_m68k('P',a.high._7_1_ >> 7,local_24,local_20,local_18,status);
      return fVar4;
    }
    if (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
        local_18 != 0) {
      if (((uVar3 & 0x7fff800000000000) == 0x7fff000000000000) &&
         (((undefined1  [16])a & (undefined1  [16])0x7fffffffffff) != (undefined1  [16])0x0 ||
          local_18 != 0)) {
        status->float_exception_flags = status->float_exception_flags | 1;
      }
      uVar2 = uVar3 << 0x10 | local_18 >> 0x30;
      uVar3 = uVar2 >> 1 | 0x8000000000000000;
      uVar1 = uVar1 << 0xf | 0x7fff;
      if (uVar2 < 2 || status->default_nan_mode != '\0') {
        uVar3 = 0xffffffffffffffff;
        uVar1 = 0x7fff;
      }
      goto LAB_006cc796;
    }
    uVar1 = uVar1 << 0xf | 0x7fff;
  }
  uVar3 = 0;
LAB_006cc796:
  fVar4._8_4_ = uVar1;
  fVar4.low = uVar3;
  fVar4._12_4_ = 0;
  return fVar4;
}

Assistant:

floatx80 float128_to_floatx80(float128 a, float_status *status)
{
    flag aSign;
    int32_t aExp;
    uint64_t aSig0, aSig1;

    aSig1 = extractFloat128Frac1( a );
    aSig0 = extractFloat128Frac0( a );
    aExp = extractFloat128Exp( a );
    aSign = extractFloat128Sign( a );
    if ( aExp == 0x7FFF ) {
        if ( aSig0 | aSig1 ) {
            return commonNaNToFloatx80(float128ToCommonNaN(a, status), status);
        }
        return packFloatx80(aSign, floatx80_infinity_high,
                                   floatx80_infinity_low);
    }
    if ( aExp == 0 ) {
        if ( ( aSig0 | aSig1 ) == 0 ) return packFloatx80( aSign, 0, 0 );
        normalizeFloat128Subnormal( aSig0, aSig1, &aExp, &aSig0, &aSig1 );
    }
    else {
        aSig0 |= UINT64_C(0x0001000000000000);
    }
    shortShift128Left( aSig0, aSig1, 15, &aSig0, &aSig1 );
    return roundAndPackFloatx80(80, aSign, aExp, aSig0, aSig1, status);

}